

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O2

AssertionResult * iuutil::CmpHelperSTRLNEQ(char *expr1,char *expr2,size_t len1,char *val2)

{
  AssertionResult *pAVar1;
  size_t in_RCX;
  AssertionResult *in_RDI;
  char *in_R8;
  size_t len2;
  size_t local_60;
  char *local_58;
  unsigned_long local_50;
  char *local_48;
  char *local_40;
  AssertionResult local_38;
  
  local_60 = strlen(in_R8);
  if (local_60 == in_RCX) {
    (in_RDI->m_message)._M_dataplus._M_p = (pointer)&(in_RDI->m_message).field_2;
    (in_RDI->m_message)._M_string_length = 0;
    (in_RDI->m_message).field_2._M_local_buf[0] = '\0';
    in_RDI->m_result = true;
  }
  else {
    local_38.m_message._M_dataplus._M_p = (pointer)&local_38.m_message.field_2;
    local_38.m_message._M_string_length = 0;
    local_38.m_message.field_2._M_local_buf[0] = '\0';
    local_38.m_result = false;
    pAVar1 = iutest::AssertionResult::operator<<(&local_38,(char (*) [18])"error: Value of: ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_40);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])" == strlen(");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_48);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [2])0x31996a);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])0x314e7d);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_58);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [4])0x30cbef);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_60);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])"\nExpected: ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_50);
    iutest::AssertionResult::AssertionResult(in_RDI,pAVar1);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return in_RDI;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperSTRLNEQ(const char* expr1, const char* expr2
                                        , size_t len1, const char* val2)
{
    const size_t len2 = strlen(val2);
    if( len2 == len1 )
    {
        return ::iutest::AssertionSuccess();
    }
    return ::iutest::AssertionFailure() << "error: Value of: " << expr1 << " == strlen(" << expr2 << ")"
        << "\n  Actual: " << val2 << " : " << len2 << "\nExpected: " << len1;
}